

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ProgramLogCase::iterate(ProgramLogCase *this)

{
  ostringstream *this_00;
  TestLog *log;
  Context *this_01;
  RenderContext *renderCtx;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ProgramSources *pPVar3;
  uint *code;
  string *this_02;
  CallLogWrapper gl;
  ResultCollector result;
  StateQueryMemoryWriteGuard<int> logLen;
  ShaderProgram program;
  undefined1 local_4c8 [40];
  undefined1 local_4a0 [40];
  undefined1 local_478 [40];
  undefined1 local_450 [40];
  undefined1 local_428 [24];
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  ResultCollector local_390;
  ProgramSources local_340;
  undefined1 local_270 [176];
  pointer local_1c0;
  undefined1 uStack_1b8;
  undefined7 uStack_1b7;
  undefined1 uStack_1b0;
  undefined8 uStack_1af;
  ShaderProgram local_f0;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_270,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&local_f0);
  tcu::ResultCollector::ResultCollector(&local_390,log,(string *)local_270);
  std::__cxx11::string::~string((string *)local_270);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_428,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  this_01 = (this->super_TestCase).m_context;
  renderCtx = this_01->m_renderCtx;
  code = &switchD_012bfd49::switchdataD_018af9c8;
  switch(this->m_buildErrorType) {
  case BUILDERROR_VERTEX_FRAGMENT:
    memset(local_270,0,0xac);
    local_1c0 = (pointer)0x0;
    uStack_1b8 = 0;
    uStack_1b7 = 0;
    uStack_1b0 = 0;
    uStack_1af = 0;
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_450,(_anonymous_namespace_ *)this_01,
               (Context *)
               "${GLSL_VERSION_DECL}\nin highp vec4 a_pos;\nuniform highp vec4 u_uniform;\nvoid main()\n{\n\tgl_Position = a_pos + u_uniform;\n}\n"
               ,(char *)code);
    glu::VertexSource::VertexSource((VertexSource *)local_4a0,(string *)local_450);
    pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)local_270,(ShaderSource *)local_4a0);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_478,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nin highp vec4 v_missingVar;\nuniform highp int u_uniform;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main()\n{\n\tfragColor = v_missingVar + vec4(float(u_uniform));\n}\n"
               ,(char *)code);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_4c8,(string *)local_478);
    pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_4c8);
    glu::ProgramSources::ProgramSources(&local_340,pPVar3);
    std::__cxx11::string::~string((string *)(local_4c8 + 8));
    std::__cxx11::string::~string((string *)local_478);
    std::__cxx11::string::~string((string *)(local_4a0 + 8));
    this_02 = (string *)local_450;
    break;
  case BUILDERROR_COMPUTE:
    memset(local_270,0,0xac);
    local_1c0 = (pointer)0x0;
    uStack_1b8 = 0;
    uStack_1b7 = 0;
    uStack_1b0 = 0;
    uStack_1af = 0;
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_4c8,(_anonymous_namespace_ *)this_01,
               (Context *)
               "${GLSL_VERSION_DECL}\nlayout (binding = 0) buffer IOBuffer { highp float buf_var; };\nuniform highp vec4 u_uniform;\nvoid main()\n{\n\tbuf_var = u_uniform.x;\n}\n"
               ,(char *)code);
    glu::ComputeSource::ComputeSource((ComputeSource *)local_4a0,(string *)local_4c8);
    pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)local_270,(ShaderSource *)local_4a0);
    glu::ProgramSources::ProgramSources(&local_340,pPVar3);
    std::__cxx11::string::~string((string *)(local_4a0 + 8));
    this_02 = (string *)local_4c8;
    break;
  case BUILDERROR_GEOMETRY:
    memset(local_270,0,0xac);
    local_1c0 = (pointer)0x0;
    uStack_1b8 = 0;
    uStack_1b7 = 0;
    uStack_1b0 = 0;
    uStack_1af = 0;
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_478,(_anonymous_namespace_ *)this_01,
               (Context *)
               "${GLSL_VERSION_DECL}\nin highp vec4 a_pos;\nuniform highp vec4 u_uniform;\nvoid main()\n{\n\tgl_Position = a_pos + u_uniform;\n}\n"
               ,(char *)code);
    glu::VertexSource::VertexSource((VertexSource *)local_4a0,(string *)local_478);
    pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)local_270,(ShaderSource *)local_4a0);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_3f0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\n${GEOMETRY_SHADER_REQUIRE}\nlayout(triangles) in;\nlayout(max_vertices=1, points) out;\nin highp vec4 v_missingVar[];\nuniform highp int u_uniform;\nvoid main()\n{\n\tgl_Position = gl_in[0].gl_Position + v_missingVar[2] + vec4(float(u_uniform));\n\tEmitVertex();\n}\n"
               ,(char *)code);
    glu::GeometrySource::GeometrySource((GeometrySource *)local_4c8,&local_3f0);
    pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_4c8);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_410,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main()\n{\n\tfragColor = vec4(1.0);\n}\n"
               ,(char *)code);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_450,&local_410);
    pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_450);
    glu::ProgramSources::ProgramSources(&local_340,pPVar3);
    std::__cxx11::string::~string((string *)(local_450 + 8));
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)(local_4c8 + 8));
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)(local_4a0 + 8));
    this_02 = (string *)local_478;
    break;
  case BUILDERROR_TESSELLATION:
    memset(local_270,0,0xac);
    local_1c0 = (pointer)0x0;
    uStack_1b8 = 0;
    uStack_1b7 = 0;
    uStack_1b0 = 0;
    uStack_1af = 0;
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_3f0,(_anonymous_namespace_ *)this_01,
               (Context *)
               "${GLSL_VERSION_DECL}\nin highp vec4 a_pos;\nvoid main()\n{\n\tgl_Position = a_pos;\n}\n"
               ,(char *)code);
    glu::VertexSource::VertexSource((VertexSource *)local_4a0,&local_3f0);
    pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)local_270,(ShaderSource *)local_4a0);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_410,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices=2) out;patch out highp vec2 vp_var;\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position\n\tgl_TessLevelOuter[0] = 0.8;\n\tgl_TessLevelOuter[1] = 0.8;\n\tif (gl_InvocationID == 0)\n\t\tvp_var = gl_in[gl_InvocationID].gl_Position.xy;\n}\n"
               ,(char *)code);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_4c8,&local_410);
    pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_4c8);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_3b0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(isolines) in;in highp float vp_var[];\nvoid main()\n{\n\tgl_Position = gl_in[gl_InvocationID].gl_Position + vec4(vp_var[1]);\n}\n"
               ,(char *)code);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_450,&local_3b0);
    pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_450);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_3d0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main()\n{\n\tfragColor = vec4(1.0);\n}\n"
               ,(char *)code);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_478,&local_3d0);
    pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_478);
    glu::ProgramSources::ProgramSources(&local_340,pPVar3);
    std::__cxx11::string::~string((string *)(local_478 + 8));
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)(local_450 + 8));
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)(local_4c8 + 8));
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)(local_4a0 + 8));
    this_02 = &local_3f0;
    break;
  default:
    memset(&local_340,0,0xac);
    local_340.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_340.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_340.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_340.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_340._193_8_ = 0;
    goto LAB_012c0199;
  }
  std::__cxx11::string::~string((string *)this_02);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_270);
LAB_012c0199:
  glu::ShaderProgram::ShaderProgram(&local_f0,renderCtx,&local_340);
  glu::ProgramSources::~ProgramSources(&local_340);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)&local_340);
  local_428[0x10] = true;
  local_270._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_270 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Trying to link a broken program.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_270,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  glu::CallLogWrapper::glGetProgramiv
            ((CallLogWrapper *)local_428,local_f0.m_program.m_program,0x8b84,
             (GLint *)((long)&local_340.sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4));
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            ((StateQueryMemoryWriteGuard<int> *)&local_340,&local_390);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)&local_340,&local_390);
  if (bVar1) {
    verifyInfoLogQuery((Functional *)&local_390,(ResultCollector *)local_428,
                       (CallLogWrapper *)
                       (ulong)local_340.sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_f0.m_program.m_program,0x1569a64,0,"glGetProgramInfoLog");
  }
  tcu::ResultCollector::setTestContextResult
            (&local_390,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::ShaderProgram::~ShaderProgram(&local_f0);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_428);
  tcu::ResultCollector::~ResultCollector(&local_390);
  return STOP;
}

Assistant:

ProgramLogCase::IterateResult ProgramLogCase::iterate (void)
{
	using gls::StateQueryUtil::StateQueryMemoryWriteGuard;

	tcu::ResultCollector					result		(m_testCtx.getLog());
	glu::CallLogWrapper						gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::ShaderProgram						program		(m_context.getRenderContext(), getProgramSources());
	StateQueryMemoryWriteGuard<glw::GLint>	logLen;

	gl.enableLogging(true);

	m_testCtx.getLog() << tcu::TestLog::Message << "Trying to link a broken program." << tcu::TestLog::EndMessage;

	gl.glGetProgramiv(program.getProgram(), GL_INFO_LOG_LENGTH, &logLen);
	logLen.verifyValidity(result);

	if (logLen.verifyValidity(result))
		verifyInfoLogQuery(result, gl, logLen, program.getProgram(), &glu::CallLogWrapper::glGetProgramInfoLog, "glGetProgramInfoLog");

	result.setTestContextResult(m_testCtx);
	return STOP;
}